

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplaceRealloc<slang::ast::LValue::BitSlice>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,pointer pos,BitSlice *args)

{
  ulong uVar1;
  size_type sVar2;
  pointer pvVar3;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var4;
  size_type sVar5;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *__rhs;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var6;
  long lVar7;
  EVP_PKEY_CTX *pEVar8;
  
  if (this->len == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x1745d1745d1745d - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x1745d1745d1745d;
  }
  lVar7 = (long)pos - (long)this->data_;
  p_Var4 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
            *)operator_new((long)pEVar8 * 0x58);
  *(ConstantRange *)((long)p_Var4 + lVar7) = args->range;
  *(undefined1 *)((long)p_Var4 + lVar7 + 0x50) = 0;
  __rhs = (EVP_PKEY_CTX *)this->data_;
  sVar2 = this->len;
  sVar5 = sVar2 * 0x58;
  p_Var6 = p_Var4;
  if (__rhs + sVar5 == (EVP_PKEY_CTX *)pos) {
    while (sVar2 != 0) {
      ctx = __rhs;
      std::__detail::__variant::
      _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                *)__rhs);
      __rhs = __rhs + 0x58;
      sVar5 = sVar5 - 0x58;
      p_Var6 = p_Var6 + 1;
      sVar2 = sVar5;
    }
  }
  else {
    for (; __rhs != (EVP_PKEY_CTX *)pos; __rhs = __rhs + 0x58) {
      ctx = __rhs;
      std::__detail::__variant::
      _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                *)__rhs);
      p_Var6 = p_Var6 + 1;
    }
    sVar2 = this->len;
    pvVar3 = this->data_;
    if ((EVP_PKEY_CTX *)(pvVar3 + sVar2) != (EVP_PKEY_CTX *)pos) {
      p_Var6 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                *)(lVar7 + (long)p_Var4);
      do {
        p_Var6 = p_Var6 + 1;
        ctx = (EVP_PKEY_CTX *)pos;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var6,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)pos);
        pos = (pointer)((long)pos + 0x58);
      } while ((EVP_PKEY_CTX *)pos != (EVP_PKEY_CTX *)(pvVar3 + sVar2));
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = (pointer)p_Var4;
  return (pointer)((long)p_Var4 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}